

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

void __thiscall fasttext::Dictionary::initNgrams(Dictionary *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  pointer peVar1;
  pointer piVar2;
  iterator __position;
  size_t __n;
  int iVar3;
  long *plVar4;
  size_type *psVar5;
  long lVar6;
  ulong uVar7;
  string word;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->size_ != 0) {
    lVar6 = 0x30;
    uVar7 = 0;
    do {
      std::operator+(&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &BOW_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)(this->words_).
                            super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar6 + -0x30));
      plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_50,EOW_abi_cxx11_);
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_70.field_2._M_allocated_capacity = *psVar5;
        local_70.field_2._8_8_ = plVar4[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar5;
        local_70._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_70._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_50._M_dataplus._M_p._4_4_,(int)local_50._M_dataplus._M_p) !=
          &local_50.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_50._M_dataplus._M_p._4_4_,(int)local_50._M_dataplus._M_p),
                        local_50.field_2._M_allocated_capacity + 1);
      }
      peVar1 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
               _M_impl.super__Vector_impl_data._M_start;
      this_00 = (vector<int,_std::allocator<int>_> *)
                ((long)&(peVar1->word)._M_dataplus._M_p + lVar6);
      piVar2 = *(pointer *)((long)&(peVar1->word)._M_dataplus._M_p + lVar6);
      if (*(pointer *)((long)&(peVar1->word)._M_string_length + lVar6) != piVar2) {
        (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = piVar2;
      }
      local_50._M_dataplus._M_p._0_4_ = (int)uVar7;
      __position._M_current = *(int **)((long)&(peVar1->word)._M_string_length + lVar6);
      if (__position._M_current == *(int **)((long)&(peVar1->word).field_2 + lVar6)) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (this_00,__position,(int *)&local_50);
      }
      else {
        *__position._M_current = (int)local_50._M_dataplus._M_p;
        (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
      peVar1 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
               _M_impl.super__Vector_impl_data._M_start;
      __n = *(size_t *)((long)peVar1 + lVar6 + -0x28);
      if (__n == DAT_001584b0) {
        if (__n != 0) {
          iVar3 = bcmp(*(void **)((long)peVar1 + lVar6 + -0x30),EOS_abi_cxx11_,__n);
          if (iVar3 != 0) goto LAB_0012bbe7;
        }
      }
      else {
LAB_0012bbe7:
        computeSubwords(this,&local_70,
                        (vector<int,_std::allocator<int>_> *)
                        ((long)&(peVar1->word)._M_dataplus._M_p + lVar6),
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)0x0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x48;
    } while (uVar7 < (ulong)(long)this->size_);
  }
  return;
}

Assistant:

void Dictionary::initNgrams() {
  for (size_t i = 0; i < size_; i++) {
    std::string word = BOW + words_[i].word + EOW;
    words_[i].subwords.clear();
    words_[i].subwords.push_back(i);
    if (words_[i].word != EOS) {
      computeSubwords(word, words_[i].subwords);
    }
  }
}